

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercuryData.h
# Opt level: O2

istream * operator>>(istream *in,MercuryParticle<3UL> *part)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 8) {
    std::istream::_M_extract<double>((double *)in);
  }
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 8) {
    std::istream::_M_extract<double>((double *)in);
  }
  std::istream::_M_extract<double>((double *)in);
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 8) {
    std::istream::_M_extract<double>((double *)in);
  }
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 8) {
    std::istream::_M_extract<double>((double *)in);
  }
  std::istream::_M_extract<unsigned_long>((ulong *)in);
  return in;
}

Assistant:

std::istream& operator>>(std::istream& in, MercuryParticle<NDIMS>& part)
{
  std::size_t i;
  for (i = 0; i < NDIMS; i++)
    in >> part.position[i];
  
  for (i = 0; i < NDIMS; i++)
    in >> part.velocity[i];
    
  in >> part.radius;
  
  for (i = 0; i < NDIMS; i++)
    in >> part.rotation[i];
    
  for (i = 0; i < NDIMS; i++)
    in >> part.angularV[i];
    
  in >> part.speciesID;
  
  return in;
}